

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O3

int __thiscall File::open(File *this,char *__file,int __oflag,...)

{
  int iVar1;
  int *piVar2;
  char *__file_00;
  __off_t _Var3;
  int iVar4;
  ulong uVar5;
  
  if (this->fp == (void *)0x0) {
    if ((~__oflag & 3U) == 0) {
      uVar5 = (ulong)((uint)((__oflag & 8U) == 0) << 6 | 0x80002);
    }
    else {
      uVar5 = 0x80000;
      if (((__oflag & 2U) != 0) && (uVar5 = 0x80001, (__oflag & 8U) == 0)) {
        uVar5 = (ulong)((uint)((__oflag & 4U) == 0) << 9 | 0x80041);
      }
    }
    __file_00 = String::operator_cast_to_char_((String *)__file);
    iVar1 = ::open(__file_00,(int)uVar5,0x1a4);
    this->fp = (void *)(long)iVar1;
    if (iVar1 == -1) {
      this->fp = (void *)0x0;
    }
    else {
      iVar4 = (int)CONCAT71((int7)(uVar5 >> 8),1);
      if ((__oflag & 4U) == 0) {
        return iVar4;
      }
      _Var3 = lseek(iVar1,0,2);
      if (_Var3 != -1) {
        return iVar4;
      }
      piVar2 = __errno_location();
      iVar1 = *piVar2;
      ::close(*(int *)&this->fp);
      this->fp = (void *)0x0;
      *piVar2 = iVar1;
    }
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
  }
  return 0;
}

Assistant:

bool File::open(const String& file, uint flags)
{
#ifdef _WIN32
  if(fp != INVALID_HANDLE_VALUE)
  {
    SetLastError(ERROR_INVALID_HANDLE);
    return false;
  }
  DWORD desiredAccess, creationDisposition;
  if((flags & (readFlag | writeFlag)) == (readFlag | writeFlag))
  {
    desiredAccess = GENERIC_READ | GENERIC_WRITE;
    if(flags & openFlag)
      creationDisposition = OPEN_EXISTING;
    else
      creationDisposition = OPEN_ALWAYS;
  }
  else if(flags & writeFlag)
  {
    desiredAccess = GENERIC_WRITE;
    if(flags & openFlag)
      creationDisposition = OPEN_EXISTING;
    else
    {
      if(flags & appendFlag)
        creationDisposition = OPEN_ALWAYS;
      else
        creationDisposition = CREATE_ALWAYS;
    }
  }
  else
  {
    desiredAccess = GENERIC_READ;
    creationDisposition = OPEN_EXISTING;
  }
  fp = CreateFile(file, desiredAccess, FILE_SHARE_READ, NULL, creationDisposition, FILE_ATTRIBUTE_NORMAL, NULL);
  if(fp == INVALID_HANDLE_VALUE)
    return false;
  if(flags & appendFlag)
  {
    if(SetFilePointer(fp, 0, NULL, FILE_END) == INVALID_SET_FILE_POINTER)
    {
      DWORD lastError = GetLastError();
      CloseHandle((HANDLE)fp);
      fp = INVALID_HANDLE_VALUE;
      SetLastError(lastError);
      return false;
    }
  }
#else
  if(fp)
  {
    errno = EINVAL;
    return false;
  }
  int oflags;
  if((flags & (readFlag | writeFlag)) == (readFlag | writeFlag))
  {
    if(flags & openFlag)
      oflags = O_RDWR; // fail if not exists, rw mode
    else
      oflags = O_CREAT | O_RDWR; // create if not exists, rw mode
  }
  else if(flags & writeFlag)
  {
    if(flags & openFlag)
      oflags =  O_WRONLY; // fail if not exists, write mode
    else
    {
      if(flags & appendFlag)
        oflags = O_CREAT | O_WRONLY; // create if not exists, write mode
      else
        oflags = O_CREAT | O_TRUNC | O_WRONLY; // create if not exists, truncate if exist, write mode
    }
  }
  else
    oflags = O_RDONLY; // do not create if not exists, read mode

  fp = (void*)(intptr_t)::open(file, oflags | O_CLOEXEC, S_IRUSR | S_IWUSR | S_IRGRP | S_IROTH);
  if((int)(intptr_t)fp == -1)
  {
    fp = 0;
    return false;
  }
  if(flags & appendFlag)
  {
    if(lseek((int)(intptr_t)fp, 0, SEEK_END) == -1)
    {
      int lastError = errno;
      ::close((int)(intptr_t)fp);
      fp = 0;
      errno = lastError;
      return false;
    }
  }
#endif

  return true;
}